

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedEnergyDamage.cpp
# Opt level: O0

int __thiscall DIS::DirectedEnergyDamage::getMarshalledSize(DirectedEnergyDamage *this)

{
  int iVar1;
  int iVar2;
  int marshalSize;
  DirectedEnergyDamage *this_local;
  
  iVar1 = Vector3Float::getMarshalledSize(&this->_damageLocation);
  iVar2 = EventIdentifier::getMarshalledSize(&this->_fireEventID);
  return iVar1 + iVar2 + 0x16;
}

Assistant:

int DirectedEnergyDamage::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _recordType
   marshalSize = marshalSize + 2;  // _recordLength
   marshalSize = marshalSize + 2;  // _padding
   marshalSize = marshalSize + _damageLocation.getMarshalledSize();  // _damageLocation
   marshalSize = marshalSize + 4;  // _damageDiameter
   marshalSize = marshalSize + 4;  // _temperature
   marshalSize = marshalSize + 1;  // _componentIdentification
   marshalSize = marshalSize + 1;  // _componentDamageStatus
   marshalSize = marshalSize + 1;  // _componentVisualDamageStatus
   marshalSize = marshalSize + 1;  // _componentVisualSmokeColor
   marshalSize = marshalSize + _fireEventID.getMarshalledSize();  // _fireEventID
   marshalSize = marshalSize + 2;  // _padding2
    return marshalSize;
}